

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextodfwriter.cpp
# Opt level: O3

void __thiscall
QTextOdfWriter::writeBlockFormat
          (QTextOdfWriter *this,QXmlStreamWriter *writer,QTextBlockFormat format,int formatIndex)

{
  char16_t *pcVar1;
  int *piVar2;
  Data *pDVar3;
  qsizetype qVar4;
  char16_t *pcVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  iterator iVar9;
  iterator iVar10;
  QDebug *pQVar11;
  QSharedDataPointer<QTextFormatPrivate> this_00;
  ulong uVar12;
  storage_type *psVar13;
  size_t sVar14;
  QArrayData *pQVar15;
  size_t sVar16;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar17;
  ulong uVar18;
  QChar *pQVar19;
  Tab *pTVar20;
  long in_FS_OFFSET;
  qreal qVar21;
  QByteArrayView QVar22;
  QAnyStringView QVar23;
  QByteArrayView QVar24;
  QByteArrayView QVar25;
  QAnyStringView QVar26;
  QByteArrayView QVar27;
  QByteArrayView QVar28;
  QAnyStringView QVar29;
  QByteArrayView QVar30;
  QAnyStringView QVar31;
  QByteArrayView QVar32;
  QByteArrayView QVar33;
  QByteArrayView QVar34;
  QAnyStringView QVar35;
  QByteArrayView QVar36;
  QByteArrayView QVar37;
  QByteArrayView QVar38;
  QByteArrayView QVar39;
  QAnyStringView QVar40;
  QByteArrayView QVar41;
  QAnyStringView QVar42;
  QByteArrayView QVar43;
  QAnyStringView QVar44;
  QByteArrayView QVar45;
  QAnyStringView QVar46;
  QByteArrayView QVar47;
  QAnyStringView QVar48;
  QByteArrayView QVar49;
  QAnyStringView QVar50;
  QByteArrayView QVar51;
  QByteArrayView QVar52;
  QAnyStringView QVar53;
  QByteArrayView QVar54;
  QByteArrayView QVar55;
  QAnyStringView QVar56;
  QByteArrayView QVar57;
  QAnyStringView QVar58;
  QByteArrayView QVar59;
  QByteArrayView QVar60;
  QAnyStringView QVar61;
  QByteArrayView QVar62;
  QAnyStringView QVar63;
  QByteArrayView QVar64;
  QAnyStringView QVar65;
  QByteArrayView QVar66;
  QAnyStringView QVar67;
  QByteArrayView QVar68;
  QByteArrayView QVar69;
  QAnyStringView QVar70;
  QByteArrayView QVar71;
  QAnyStringView QVar72;
  QAnyStringView QVar73;
  QAnyStringView QVar74;
  QAnyStringView QVar75;
  QAnyStringView QVar76;
  QAnyStringView QVar77;
  QAnyStringView QVar78;
  QAnyStringView QVar79;
  QAnyStringView QVar80;
  QAnyStringView QVar81;
  QAnyStringView QVar82;
  QAnyStringView QVar83;
  QAnyStringView QVar84;
  QAnyStringView QVar85;
  QAnyStringView QVar86;
  QAnyStringView QVar87;
  QAnyStringView QVar88;
  QAnyStringView QVar89;
  QAnyStringView QVar90;
  QAnyStringView QVar91;
  QAnyStringView QVar92;
  QAnyStringView QVar93;
  QAnyStringView QVar94;
  QAnyStringView QVar95;
  QAnyStringView QVar96;
  QAnyStringView QVar97;
  QAnyStringView QVar98;
  QAnyStringView QVar99;
  QAnyStringView QVar100;
  QAnyStringView QVar101;
  QAnyStringView QVar102;
  QAnyStringView QVar103;
  QAnyStringView QVar104;
  QAnyStringView QVar105;
  QAnyStringView QVar106;
  QAnyStringView QVar107;
  QAnyStringView QVar108;
  QBrush brush;
  QArrayData *local_1f0;
  QArrayData *local_1e8;
  QDebug local_f8;
  QDebug local_f0 [2];
  ulong uStack_e0;
  QArrayData *local_d8;
  char16_t *pcStack_d0;
  qsizetype local_c8;
  QStringBuilder<QString,_QString> local_b8;
  char16_t *local_88;
  ulong uStack_80;
  QString local_78;
  QString local_60;
  char16_t *local_48;
  ulong uStack_40;
  long local_38;
  
  this_00 = format.super_QTextFormat.d.d.ptr;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar1 = (this->styleNS).d.ptr;
  uVar12 = (this->styleNS).d.size;
  QVar22.m_data = &DAT_00000005;
  QVar22.m_size = (qsizetype)&local_b8;
  QString::fromLatin1(QVar22);
  QVar73.m_size._4_4_ = local_b8.a.d.ptr._4_4_;
  QVar73.m_size._0_4_ = local_b8.a.d.ptr._0_4_;
  QVar23.m_size = (size_t)pcVar1;
  QVar23.field_0.m_data_utf8 = (char *)writer;
  QVar73.field_0.m_data = (void *)(uVar12 | 0x8000000000000000);
  QXmlStreamWriter::writeStartElement(QVar23,QVar73);
  piVar2 = (int *)CONCAT44(local_b8.a.d.d._4_4_,local_b8.a.d.d._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      QArrayData::deallocate
                ((QArrayData *)CONCAT44(local_b8.a.d.d._4_4_,local_b8.a.d.d._0_4_),2,0x10);
    }
  }
  pcVar1 = (this->styleNS).d.ptr;
  uVar12 = (this->styleNS).d.size;
  QVar24.m_data = (storage_type *)0x4;
  QVar24.m_size = (qsizetype)&local_b8;
  QString::fromLatin1(QVar24);
  QVar74.m_size._4_4_ = local_b8.a.d.ptr._4_4_;
  QVar74.m_size._0_4_ = local_b8.a.d.ptr._0_4_;
  uVar18 = CONCAT44(local_b8.a.d.size._4_4_,(undefined4)local_b8.a.d.size);
  QVar25.m_data = (storage_type *)0x3;
  QVar25.m_size = (qsizetype)&local_78;
  QString::fromLatin1(QVar25);
  sVar14 = 0x20;
  QString::arg_impl((longlong)&local_60,(int)&local_78,format.super_QTextFormat.format_type,
                    (QChar)0x0);
  local_48 = local_60.d.ptr;
  uStack_40 = local_60.d.size | 0x8000000000000000;
  QVar26.m_size = (size_t)pcVar1;
  QVar26.field_0.m_data_utf8 = (char *)writer;
  QVar74.field_0.m_data = (void *)(uVar12 | 0x8000000000000000);
  QVar93.m_size = sVar14;
  QVar93.field_0.m_data = (void *)(uVar18 | 0x8000000000000000);
  QXmlStreamWriter::writeAttribute(QVar26,QVar74,QVar93);
  if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QTextFormatPrivate *)local_78.d.d != (QTextFormatPrivate *)0x0) {
    LOCK();
    *(int *)local_78.d.d = *(int *)local_78.d.d + -1;
    UNLOCK();
    if (*(int *)local_78.d.d == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
  piVar2 = (int *)CONCAT44(local_b8.a.d.d._4_4_,local_b8.a.d.d._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      QArrayData::deallocate
                ((QArrayData *)CONCAT44(local_b8.a.d.d._4_4_,local_b8.a.d.d._0_4_),2,0x10);
    }
  }
  pcVar1 = (this->styleNS).d.ptr;
  uVar12 = (this->styleNS).d.size;
  QVar27.m_data = &DAT_00000006;
  QVar27.m_size = (qsizetype)&local_b8;
  QString::fromLatin1(QVar27);
  QVar75.m_size._4_4_ = local_b8.a.d.ptr._4_4_;
  QVar75.m_size._0_4_ = local_b8.a.d.ptr._0_4_;
  uVar18 = CONCAT44(local_b8.a.d.size._4_4_,(undefined4)local_b8.a.d.size);
  QVar28.m_data = (storage_type *)0x9;
  QVar28.m_size = (qsizetype)&local_60;
  QString::fromLatin1(QVar28);
  local_88 = local_60.d.ptr;
  uStack_80 = local_60.d.size | 0x8000000000000000;
  QVar29.m_size = (size_t)pcVar1;
  QVar29.field_0.m_data_utf8 = (char *)writer;
  QVar75.field_0.m_data = (void *)(uVar12 | 0x8000000000000000);
  QVar94.m_size = sVar14;
  QVar94.field_0.m_data = (void *)(uVar18 | 0x8000000000000000);
  QXmlStreamWriter::writeAttribute(QVar29,QVar75,QVar94);
  if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
    }
  }
  piVar2 = (int *)CONCAT44(local_b8.a.d.d._4_4_,local_b8.a.d.d._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      QArrayData::deallocate
                ((QArrayData *)CONCAT44(local_b8.a.d.d._4_4_,local_b8.a.d.d._0_4_),2,0x10);
    }
  }
  pcVar1 = (this->styleNS).d.ptr;
  uVar12 = (this->styleNS).d.size;
  QVar30.m_data = (storage_type *)0x14;
  QVar30.m_size = (qsizetype)&local_b8;
  QString::fromLatin1(QVar30);
  QVar76.m_size._4_4_ = local_b8.a.d.ptr._4_4_;
  QVar76.m_size._0_4_ = local_b8.a.d.ptr._0_4_;
  QVar31.m_size = (size_t)pcVar1;
  QVar31.field_0.m_data_utf8 = (char *)writer;
  QVar76.field_0.m_data = (void *)(uVar12 | 0x8000000000000000);
  QXmlStreamWriter::writeStartElement(QVar31,QVar76);
  piVar2 = (int *)CONCAT44(local_b8.a.d.d._4_4_,local_b8.a.d.d._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      QArrayData::deallocate
                ((QArrayData *)CONCAT44(local_b8.a.d.d._4_4_,local_b8.a.d.d._0_4_),2,0x10);
    }
  }
  bVar6 = QTextFormat::hasProperty((QTextFormat *)this_00.d.ptr,0x1049);
  if (bVar6) {
    iVar7 = QTextFormat::intProperty((QTextFormat *)this_00.d.ptr,0x1049);
    qVar21 = QTextFormat::doubleProperty((QTextFormat *)this_00.d.ptr,0x1048);
    switch(iVar7) {
    case 0:
      QVar32.m_data = (storage_type *)0xb;
      QVar32.m_size = (qsizetype)&local_b8;
      QString::fromLatin1(QVar32);
      local_1e8 = (QArrayData *)CONCAT44(local_b8.a.d.d._4_4_,local_b8.a.d.d._0_4_);
      sVar16 = CONCAT44(local_b8.a.d.ptr._4_4_,local_b8.a.d.ptr._0_4_);
      uVar12 = CONCAT44(local_b8.a.d.size._4_4_,(undefined4)local_b8.a.d.size);
      QVar33.m_data = (storage_type *)0x4;
      QVar33.m_size = (qsizetype)&local_b8;
      QString::fromLatin1(QVar33);
      goto LAB_005b9913;
    case 1:
      QVar36.m_data = (storage_type *)0xb;
      QVar36.m_size = (qsizetype)&local_b8;
      QString::fromLatin1(QVar36);
      local_1e8 = (QArrayData *)CONCAT44(local_b8.a.d.d._4_4_,local_b8.a.d.d._0_4_);
      sVar16 = CONCAT44(local_b8.a.d.ptr._4_4_,local_b8.a.d.ptr._0_4_);
      uVar12 = CONCAT44(local_b8.a.d.size._4_4_,(undefined4)local_b8.a.d.size);
      QString::number(qVar21,(char)&local_78,0x67);
      QVar37.m_data = (storage_type *)0x1;
      QVar37.m_size = (qsizetype)&local_d8;
      QString::fromLatin1(QVar37);
      qVar4 = local_78.d.size;
      pcVar1 = local_78.d.ptr;
      pDVar3 = local_78.d.d;
      local_b8.b.d.size = local_c8;
      local_b8.b.d.ptr = pcStack_d0;
      local_b8.b.d.d = (Data *)local_d8;
      local_78.d.d = (Data *)0x0;
      local_78.d.ptr = (char16_t *)0x0;
      local_b8.a.d.d._0_4_ = SUB84(pDVar3,0);
      local_b8.a.d.d._4_4_ = (undefined4)((ulong)pDVar3 >> 0x20);
      local_b8.a.d.ptr._0_4_ = SUB84(pcVar1,0);
      local_b8.a.d.ptr._4_4_ = (undefined4)((ulong)pcVar1 >> 0x20);
      local_78.d.size = 0;
      local_b8.a.d.size._0_4_ = (undefined4)qVar4;
      local_b8.a.d.size._4_4_ = (undefined4)((ulong)qVar4 >> 0x20);
      local_d8 = (QArrayData *)0x0;
      pcStack_d0 = (char16_t *)0x0;
      local_c8 = 0;
      QStringBuilder<QString,_QString>::convertTo<QString>(&local_60,&local_b8);
      uVar18 = local_60.d.size;
      pQVar15 = &(local_60.d.d)->super_QArrayData;
      local_60.d.d = (Data *)0x0;
      local_60.d.ptr = (char16_t *)0x0;
      local_60.d.size = 0;
      QStringBuilder<QString,_QString>::~QStringBuilder(&local_b8);
      if (local_d8 != (QArrayData *)0x0) {
        LOCK();
        (local_d8->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_d8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_d8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_d8,2,0x10);
        }
      }
      if ((QTextFormatPrivate *)local_78.d.d != (QTextFormatPrivate *)0x0) {
        LOCK();
        *(int *)local_78.d.d = *(int *)local_78.d.d + -1;
        UNLOCK();
        if (*(int *)local_78.d.d == 0) {
          QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
        }
      }
      goto LAB_005b991e;
    case 2:
      psVar13 = (storage_type *)0xb;
      break;
    case 3:
      psVar13 = (storage_type *)0x14;
      break;
    case 4:
      psVar13 = &DAT_0000000c;
      break;
    default:
      goto switchD_005b984a_default;
    }
    QVar34.m_data = psVar13;
    QVar34.m_size = (qsizetype)&local_b8;
    QString::fromLatin1(QVar34);
    local_1e8 = (QArrayData *)CONCAT44(local_b8.a.d.d._4_4_,local_b8.a.d.d._0_4_);
    sVar16 = CONCAT44(local_b8.a.d.ptr._4_4_,local_b8.a.d.ptr._0_4_);
    uVar12 = CONCAT44(local_b8.a.d.size._4_4_,(undefined4)local_b8.a.d.size);
    if (qVar21 <= 0.0) {
      qVar21 = 0.0;
    }
    pixelToPoint(&local_b8.a,qVar21);
LAB_005b9913:
    pQVar15 = (QArrayData *)CONCAT44(local_b8.a.d.d._4_4_,local_b8.a.d.d._0_4_);
    uVar18 = CONCAT44(local_b8.a.d.size._4_4_,(undefined4)local_b8.a.d.size);
LAB_005b991e:
    if (sVar16 != 0) {
      QVar77.field_0.m_data = (void *)((this->styleNS).d.size | 0x8000000000000000);
      uStack_e0 = uVar18 | 0x8000000000000000;
      QVar35.m_size = (size_t)(this->styleNS).d.ptr;
      QVar35.field_0.m_data_utf8 = (char *)writer;
      QVar77.m_size = sVar16;
      QVar95.m_size = sVar14;
      QVar95.field_0.m_data = (void *)(uVar12 | 0x8000000000000000);
      QXmlStreamWriter::writeAttribute(QVar35,QVar77,QVar95);
    }
    if (pQVar15 != (QArrayData *)0x0) {
      LOCK();
      (pQVar15->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar15->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar15->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar15,2,0x10);
      }
    }
    if (local_1e8 != (QArrayData *)0x0) {
      LOCK();
      (local_1e8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_1e8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_1e8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_1e8,2,0x10);
      }
    }
  }
switchD_005b984a_default:
  bVar6 = QTextFormat::hasProperty((QTextFormat *)this_00.d.ptr,0x1010);
  if (!bVar6) goto LAB_005b9cbc;
  iVar7 = QTextFormat::intProperty((QTextFormat *)this_00.d.ptr,0x1010);
  uVar8 = iVar7 + (uint)(iVar7 == 0) & 0x1f;
  switch(uVar8) {
  case 1:
LAB_005b9a1d:
    psVar13 = &DAT_00000005;
    break;
  case 2:
    psVar13 = (storage_type *)0x3;
    break;
  case 3:
  case 5:
  case 6:
  case 7:
switchD_005b99f8_caseD_3:
    local_b8.a.d.d._0_4_ = 2;
    local_b8.a.d.d._4_4_ = 0;
    local_b8.a.d.ptr._0_4_ = 0;
    local_b8.a.d.ptr._4_4_ = 0;
    local_b8.a.d.size._0_4_ = 0;
    local_b8.a.d.size._4_4_ = 0;
    local_b8.b.d.d = (Data *)0x6a102e;
    QMessageLogger::warning();
    pQVar11 = QDebug::operator<<((QDebug *)&local_60,
                                 "QTextOdfWriter: unsupported paragraph alignment; ");
    local_f8.stream = pQVar11->stream;
    (local_f8.stream)->ref = (local_f8.stream)->ref + 1;
    iVar7 = QTextFormat::intProperty((QTextFormat *)this_00.d.ptr,0x1010);
    qt_QMetaEnum_flagDebugOperator
              ((QDebug *)local_f0,(ulonglong)&local_f8,
               (QMetaObject *)(ulong)(iVar7 + (uint)(iVar7 == 0)),(char *)&Qt::staticMetaObject);
    QDebug::~QDebug(local_f0);
    QDebug::~QDebug(&local_f8);
    QDebug::~QDebug((QDebug *)&local_60);
    goto LAB_005b9cbc;
  case 4:
    psVar13 = &DAT_00000006;
    break;
  case 8:
    psVar13 = (storage_type *)0x7;
    break;
  default:
    if (uVar8 != 0x11) {
      if (uVar8 != 0x12) goto switchD_005b99f8_caseD_3;
      goto LAB_005b9a1d;
    }
    psVar13 = (storage_type *)0x4;
  }
  QVar38.m_data = psVar13;
  QVar38.m_size = (qsizetype)&local_b8;
  QString::fromLatin1(QVar38);
  pQVar15 = (QArrayData *)CONCAT44(local_b8.a.d.d._4_4_,local_b8.a.d.d._0_4_);
  if (CONCAT44(local_b8.a.d.ptr._4_4_,local_b8.a.d.ptr._0_4_) != 0) {
    pcVar1 = (this->foNS).d.ptr;
    uVar12 = (this->foNS).d.size;
    QVar39.m_data = (storage_type *)0xa;
    QVar39.m_size = (qsizetype)&local_b8;
    QString::fromLatin1(QVar39);
    QVar78.m_size._4_4_ = local_b8.a.d.ptr._4_4_;
    QVar78.m_size._0_4_ = local_b8.a.d.ptr._0_4_;
    QVar96.field_0.m_data =
         (void *)(CONCAT44(local_b8.a.d.size._4_4_,(undefined4)local_b8.a.d.size) |
                 0x8000000000000000);
    QVar40.m_size = (size_t)pcVar1;
    QVar40.field_0.m_data_utf8 = (char *)writer;
    QVar78.field_0.m_data = (void *)(uVar12 | 0x8000000000000000);
    QVar96.m_size = sVar14;
    QXmlStreamWriter::writeAttribute(QVar40,QVar78,QVar96);
    piVar2 = (int *)CONCAT44(local_b8.a.d.d._4_4_,local_b8.a.d.d._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        QArrayData::deallocate
                  ((QArrayData *)CONCAT44(local_b8.a.d.d._4_4_,local_b8.a.d.d._0_4_),2,0x10);
      }
    }
  }
  if (pQVar15 != (QArrayData *)0x0) {
    LOCK();
    (pQVar15->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar15->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar15->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar15,2,0x10);
    }
  }
LAB_005b9cbc:
  bVar6 = QTextFormat::hasProperty((QTextFormat *)this_00.d.ptr,0x1030);
  if (bVar6) {
    pcVar1 = (this->foNS).d.ptr;
    uVar12 = (this->foNS).d.size;
    QVar41.m_data = (storage_type *)0xa;
    QVar41.m_size = (qsizetype)&local_b8;
    QString::fromLatin1(QVar41);
    QVar79.m_size._4_4_ = local_b8.a.d.ptr._4_4_;
    QVar79.m_size._0_4_ = local_b8.a.d.ptr._0_4_;
    uVar18 = CONCAT44(local_b8.a.d.size._4_4_,(undefined4)local_b8.a.d.size);
    qVar21 = QTextFormat::doubleProperty((QTextFormat *)this_00.d.ptr,0x1030);
    if (qVar21 <= 0.0) {
      qVar21 = 0.0;
    }
    pixelToPoint(&local_60,qVar21);
    QVar42.m_size = (size_t)pcVar1;
    QVar42.field_0.m_data_utf8 = (char *)writer;
    QVar79.field_0.m_data = (void *)(uVar12 | 0x8000000000000000);
    QVar97.m_size = sVar14;
    QVar97.field_0.m_data = (void *)(uVar18 | 0x8000000000000000);
    QXmlStreamWriter::writeAttribute(QVar42,QVar79,QVar97);
    if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
      }
    }
    piVar2 = (int *)CONCAT44(local_b8.a.d.d._4_4_,local_b8.a.d.d._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        QArrayData::deallocate
                  ((QArrayData *)CONCAT44(local_b8.a.d.d._4_4_,local_b8.a.d.d._0_4_),2,0x10);
      }
    }
  }
  bVar6 = QTextFormat::hasProperty((QTextFormat *)this_00.d.ptr,0x1031);
  if (bVar6) {
    pcVar1 = (this->foNS).d.ptr;
    uVar12 = (this->foNS).d.size;
    QVar43.m_data = (storage_type *)0xd;
    QVar43.m_size = (qsizetype)&local_b8;
    QString::fromLatin1(QVar43);
    QVar80.m_size._4_4_ = local_b8.a.d.ptr._4_4_;
    QVar80.m_size._0_4_ = local_b8.a.d.ptr._0_4_;
    uVar18 = CONCAT44(local_b8.a.d.size._4_4_,(undefined4)local_b8.a.d.size);
    qVar21 = QTextFormat::doubleProperty((QTextFormat *)this_00.d.ptr,0x1031);
    if (qVar21 <= 0.0) {
      qVar21 = 0.0;
    }
    pixelToPoint(&local_60,qVar21);
    QVar44.m_size = (size_t)pcVar1;
    QVar44.field_0.m_data_utf8 = (char *)writer;
    QVar80.field_0.m_data = (void *)(uVar12 | 0x8000000000000000);
    QVar98.m_size = sVar14;
    QVar98.field_0.m_data = (void *)(uVar18 | 0x8000000000000000);
    QXmlStreamWriter::writeAttribute(QVar44,QVar80,QVar98);
    if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
      }
    }
    piVar2 = (int *)CONCAT44(local_b8.a.d.d._4_4_,local_b8.a.d.d._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        QArrayData::deallocate
                  ((QArrayData *)CONCAT44(local_b8.a.d.d._4_4_,local_b8.a.d.d._0_4_),2,0x10);
      }
    }
  }
  bVar6 = QTextFormat::hasProperty((QTextFormat *)this_00.d.ptr,0x1032);
  if ((bVar6) || (bVar6 = QTextFormat::hasProperty((QTextFormat *)this_00.d.ptr,0x1040), bVar6)) {
    pcVar1 = (this->foNS).d.ptr;
    uVar12 = (this->foNS).d.size;
    QVar45.m_data = (storage_type *)0xb;
    QVar45.m_size = (qsizetype)&local_b8;
    QString::fromLatin1(QVar45);
    QVar81.m_size._4_4_ = local_b8.a.d.ptr._4_4_;
    QVar81.m_size._0_4_ = local_b8.a.d.ptr._0_4_;
    uVar18 = CONCAT44(local_b8.a.d.size._4_4_,(undefined4)local_b8.a.d.size);
    qVar21 = QTextFormat::doubleProperty((QTextFormat *)this_00.d.ptr,0x1032);
    iVar7 = QTextFormat::intProperty((QTextFormat *)this_00.d.ptr,0x1040);
    qVar21 = (double)iVar7 + qVar21;
    if (qVar21 <= 0.0) {
      qVar21 = 0.0;
    }
    pixelToPoint(&local_60,qVar21);
    QVar46.m_size = (size_t)pcVar1;
    QVar46.field_0.m_data_utf8 = (char *)writer;
    QVar81.field_0.m_data = (void *)(uVar12 | 0x8000000000000000);
    QVar99.m_size = sVar14;
    QVar99.field_0.m_data = (void *)(uVar18 | 0x8000000000000000);
    QXmlStreamWriter::writeAttribute(QVar46,QVar81,QVar99);
    if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
      }
    }
    piVar2 = (int *)CONCAT44(local_b8.a.d.d._4_4_,local_b8.a.d.d._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        QArrayData::deallocate
                  ((QArrayData *)CONCAT44(local_b8.a.d.d._4_4_,local_b8.a.d.d._0_4_),2,0x10);
      }
    }
  }
  bVar6 = QTextFormat::hasProperty((QTextFormat *)this_00.d.ptr,0x1033);
  if (bVar6) {
    pcVar1 = (this->foNS).d.ptr;
    uVar12 = (this->foNS).d.size;
    QVar47.m_data = &DAT_0000000c;
    QVar47.m_size = (qsizetype)&local_b8;
    QString::fromLatin1(QVar47);
    QVar82.m_size._4_4_ = local_b8.a.d.ptr._4_4_;
    QVar82.m_size._0_4_ = local_b8.a.d.ptr._0_4_;
    uVar18 = CONCAT44(local_b8.a.d.size._4_4_,(undefined4)local_b8.a.d.size);
    qVar21 = QTextFormat::doubleProperty((QTextFormat *)this_00.d.ptr,0x1033);
    if (qVar21 <= 0.0) {
      qVar21 = 0.0;
    }
    pixelToPoint(&local_60,qVar21);
    QVar48.m_size = (size_t)pcVar1;
    QVar48.field_0.m_data_utf8 = (char *)writer;
    QVar82.field_0.m_data = (void *)(uVar12 | 0x8000000000000000);
    QVar100.m_size = sVar14;
    QVar100.field_0.m_data = (void *)(uVar18 | 0x8000000000000000);
    QXmlStreamWriter::writeAttribute(QVar48,QVar82,QVar100);
    if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
      }
    }
    piVar2 = (int *)CONCAT44(local_b8.a.d.d._4_4_,local_b8.a.d.d._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        QArrayData::deallocate
                  ((QArrayData *)CONCAT44(local_b8.a.d.d._4_4_,local_b8.a.d.d._0_4_),2,0x10);
      }
    }
  }
  bVar6 = QTextFormat::hasProperty((QTextFormat *)this_00.d.ptr,0x1034);
  if (bVar6) {
    pcVar1 = (this->foNS).d.ptr;
    uVar12 = (this->foNS).d.size;
    QVar49.m_data = (storage_type *)0xb;
    QVar49.m_size = (qsizetype)&local_b8;
    QString::fromLatin1(QVar49);
    QVar83.m_size._4_4_ = local_b8.a.d.ptr._4_4_;
    QVar83.m_size._0_4_ = local_b8.a.d.ptr._0_4_;
    uVar18 = CONCAT44(local_b8.a.d.size._4_4_,(undefined4)local_b8.a.d.size);
    qVar21 = QTextFormat::doubleProperty((QTextFormat *)this_00.d.ptr,0x1034);
    pixelToPoint(&local_60,qVar21);
    QVar50.m_size = (size_t)pcVar1;
    QVar50.field_0.m_data_utf8 = (char *)writer;
    QVar83.field_0.m_data = (void *)(uVar12 | 0x8000000000000000);
    QVar101.m_size = sVar14;
    QVar101.field_0.m_data = (void *)(uVar18 | 0x8000000000000000);
    QXmlStreamWriter::writeAttribute(QVar50,QVar83,QVar101);
    if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
      }
    }
    piVar2 = (int *)CONCAT44(local_b8.a.d.d._4_4_,local_b8.a.d.d._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        QArrayData::deallocate
                  ((QArrayData *)CONCAT44(local_b8.a.d.d._4_4_,local_b8.a.d.d._0_4_),2,0x10);
      }
    }
  }
  bVar6 = QTextFormat::hasProperty((QTextFormat *)this_00.d.ptr,0x7000);
  if (bVar6) {
    uVar8 = QTextFormat::intProperty((QTextFormat *)this_00.d.ptr,0x7000);
    if ((uVar8 & 1) != 0) {
      pcVar1 = (this->foNS).d.ptr;
      uVar12 = (this->foNS).d.size;
      QVar51.m_data = &DAT_0000000c;
      QVar51.m_size = (qsizetype)&local_b8;
      QString::fromLatin1(QVar51);
      QVar84.m_size._4_4_ = local_b8.a.d.ptr._4_4_;
      QVar84.m_size._0_4_ = local_b8.a.d.ptr._0_4_;
      uVar18 = CONCAT44(local_b8.a.d.size._4_4_,(undefined4)local_b8.a.d.size);
      QVar52.m_data = (storage_type *)0x4;
      QVar52.m_size = (qsizetype)&local_60;
      QString::fromLatin1(QVar52);
      QVar53.m_size = (size_t)pcVar1;
      QVar53.field_0.m_data_utf8 = (char *)writer;
      QVar84.field_0.m_data = (void *)(uVar12 | 0x8000000000000000);
      QVar102.m_size = sVar14;
      QVar102.field_0.m_data = (void *)(uVar18 | 0x8000000000000000);
      QXmlStreamWriter::writeAttribute(QVar53,QVar84,QVar102);
      if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
        }
      }
      piVar2 = (int *)CONCAT44(local_b8.a.d.d._4_4_,local_b8.a.d.d._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          QArrayData::deallocate
                    ((QArrayData *)CONCAT44(local_b8.a.d.d._4_4_,local_b8.a.d.d._0_4_),2,0x10);
        }
      }
    }
    uVar8 = QTextFormat::intProperty((QTextFormat *)this_00.d.ptr,0x7000);
    if ((uVar8 & 0x10) != 0) {
      pcVar1 = (this->foNS).d.ptr;
      uVar12 = (this->foNS).d.size;
      QVar54.m_data = (storage_type *)0xb;
      QVar54.m_size = (qsizetype)&local_b8;
      QString::fromLatin1(QVar54);
      QVar85.m_size._4_4_ = local_b8.a.d.ptr._4_4_;
      QVar85.m_size._0_4_ = local_b8.a.d.ptr._0_4_;
      uVar18 = CONCAT44(local_b8.a.d.size._4_4_,(undefined4)local_b8.a.d.size);
      QVar55.m_data = (storage_type *)0x4;
      QVar55.m_size = (qsizetype)&local_60;
      QString::fromLatin1(QVar55);
      QVar56.m_size = (size_t)pcVar1;
      QVar56.field_0.m_data_utf8 = (char *)writer;
      QVar85.field_0.m_data = (void *)(uVar12 | 0x8000000000000000);
      QVar103.m_size = sVar14;
      QVar103.field_0.m_data = (void *)(uVar18 | 0x8000000000000000);
      QXmlStreamWriter::writeAttribute(QVar56,QVar85,QVar103);
      if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
        }
      }
      piVar2 = (int *)CONCAT44(local_b8.a.d.d._4_4_,local_b8.a.d.d._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          QArrayData::deallocate
                    ((QArrayData *)CONCAT44(local_b8.a.d.d._4_4_,local_b8.a.d.d._0_4_),2,0x10);
        }
      }
    }
  }
  bVar6 = QTextFormat::hasProperty((QTextFormat *)this_00.d.ptr,0x820);
  if (bVar6) {
    local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    QTextFormat::brushProperty((QTextFormat *)&local_78,(int)format.super_QTextFormat.d.d.ptr);
    pcVar1 = (this->foNS).d.ptr;
    uVar12 = (this->foNS).d.size;
    QVar57.m_data = &DAT_00000010;
    QVar57.m_size = (qsizetype)&local_b8;
    QString::fromLatin1(QVar57);
    QVar86.m_size._4_4_ = local_b8.a.d.ptr._4_4_;
    QVar86.m_size._0_4_ = local_b8.a.d.ptr._0_4_;
    uVar18 = CONCAT44(local_b8.a.d.size._4_4_,(undefined4)local_b8.a.d.size);
    QColor::name(&local_60,(QColor *)((long)local_78.d.d + 8),HexRgb);
    QVar58.m_size = (size_t)pcVar1;
    QVar58.field_0.m_data_utf8 = (char *)writer;
    QVar86.field_0.m_data = (void *)(uVar12 | 0x8000000000000000);
    QVar104.m_size = sVar14;
    QVar104.field_0.m_data = (void *)(uVar18 | 0x8000000000000000);
    QXmlStreamWriter::writeAttribute(QVar58,QVar86,QVar104);
    if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
      }
    }
    piVar2 = (int *)CONCAT44(local_b8.a.d.d._4_4_,local_b8.a.d.d._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        QArrayData::deallocate
                  ((QArrayData *)CONCAT44(local_b8.a.d.d._4_4_,local_b8.a.d.d._0_4_),2,0x10);
      }
    }
    QBrush::~QBrush((QBrush *)&local_78);
  }
  bVar6 = QTextFormat::hasProperty((QTextFormat *)this_00.d.ptr,0x1050);
  if (bVar6) {
    pcVar1 = (this->foNS).d.ptr;
    uVar12 = (this->foNS).d.size;
    QVar59.m_data = (storage_type *)0xd;
    QVar59.m_size = (qsizetype)&local_b8;
    QString::fromLatin1(QVar59);
    QVar87.m_size._4_4_ = local_b8.a.d.ptr._4_4_;
    QVar87.m_size._0_4_ = local_b8.a.d.ptr._0_4_;
    uVar18 = CONCAT44(local_b8.a.d.size._4_4_,(undefined4)local_b8.a.d.size);
    bVar6 = QTextFormat::boolProperty((QTextFormat *)this_00.d.ptr,0x1050);
    if (bVar6) {
      psVar13 = (storage_type *)0x4;
    }
    else {
      psVar13 = &DAT_00000005;
    }
    QVar60.m_size = &local_60;
    QVar60.m_data = psVar13;
    QString::fromLatin1(QVar60);
    QVar61.m_size = (size_t)pcVar1;
    QVar61.field_0.m_data_utf8 = (char *)writer;
    QVar87.field_0.m_data = (void *)(uVar12 | 0x8000000000000000);
    QVar105.m_size = sVar14;
    QVar105.field_0.m_data = (void *)(uVar18 | 0x8000000000000000);
    QXmlStreamWriter::writeAttribute(QVar61,QVar87,QVar105);
    if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
      }
    }
    piVar2 = (int *)CONCAT44(local_b8.a.d.d._4_4_,local_b8.a.d.d._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        QArrayData::deallocate
                  ((QArrayData *)CONCAT44(local_b8.a.d.d._4_4_,local_b8.a.d.d._0_4_),2,0x10);
      }
    }
  }
  bVar6 = QTextFormat::hasProperty((QTextFormat *)this_00.d.ptr,0x1035);
  if (bVar6) {
    local_b8.a.d.size._0_4_ = 0xaaaaaaaa;
    local_b8.a.d.size._4_4_ = 0xaaaaaaaa;
    local_b8.a.d.d._0_4_ = 0xaaaaaaaa;
    local_b8.a.d.d._4_4_ = 0xaaaaaaaa;
    local_b8.a.d.ptr._0_4_ = 0xaaaaaaaa;
    local_b8.a.d.ptr._4_4_ = 0xaaaaaaaa;
    QTextBlockFormat::tabPositions
              ((QList<QTextOption::Tab> *)&local_b8,(QTextBlockFormat *)this_00.d.ptr);
    pcVar1 = (this->styleNS).d.ptr;
    uVar12 = (this->styleNS).d.size;
    QVar62.m_data = (storage_type *)0x9;
    QVar62.m_size = (qsizetype)&local_60;
    QString::fromLatin1(QVar62);
    QVar63.m_size = (size_t)pcVar1;
    QVar63.field_0.m_data_utf8 = (char *)writer;
    QVar88.m_size = (size_t)local_60.d.ptr;
    QVar88.field_0.m_data = (void *)(uVar12 | 0x8000000000000000);
    QXmlStreamWriter::writeStartElement(QVar63,QVar88);
    if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
      }
    }
    iVar9 = QList<QTextOption::Tab>::begin((QList<QTextOption::Tab> *)&local_b8);
    iVar10 = QList<QTextOption::Tab>::end((QList<QTextOption::Tab> *)&local_b8);
    if (iVar9.i != iVar10.i) {
      pQVar19 = &(iVar9.i)->delimiter;
      do {
        pcVar1 = (this->styleNS).d.ptr;
        uVar12 = (this->styleNS).d.size;
        QVar64.m_data = &DAT_00000008;
        QVar64.m_size = (qsizetype)&local_60;
        QString::fromLatin1(QVar64);
        QVar65.m_size = (size_t)pcVar1;
        QVar65.field_0.m_data_utf8 = (char *)writer;
        QVar89.m_size = (size_t)local_60.d.ptr;
        QVar89.field_0.m_data = (void *)(uVar12 | 0x8000000000000000);
        QXmlStreamWriter::writeEmptyElement(QVar65,QVar89);
        if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
          }
        }
        pcVar1 = (this->styleNS).d.ptr;
        uVar12 = (this->styleNS).d.size;
        QVar66.m_data = &DAT_00000008;
        QVar66.m_size = (qsizetype)&local_60;
        QString::fromLatin1(QVar66);
        pcVar5 = local_60.d.ptr;
        aVar17.m_data = (void *)(local_60.d.size | 0x8000000000000000);
        pixelToPoint(&local_78,((Tab *)(pQVar19 + -6))->position);
        QVar67.m_size = (size_t)pcVar1;
        QVar67.field_0.m_data_utf8 = (char *)writer;
        QVar90.m_size = (size_t)pcVar5;
        QVar90.field_0.m_data = (void *)(uVar12 | 0x8000000000000000);
        QVar106.m_size = sVar14;
        QVar106.field_0.m_data = aVar17.m_data;
        QXmlStreamWriter::writeAttribute(QVar67,QVar90,QVar106);
        if ((QTextFormatPrivate *)local_78.d.d != (QTextFormatPrivate *)0x0) {
          LOCK();
          *(int *)local_78.d.d = *(int *)local_78.d.d + -1;
          UNLOCK();
          if (*(int *)local_78.d.d == 0) {
            QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
          }
        }
        switch(*(TabType *)(pQVar19 + -2)) {
        case LeftTab:
          psVar13 = (storage_type *)0x4;
          break;
        case RightTab:
          psVar13 = &DAT_00000005;
          break;
        case CenterTab:
          psVar13 = &DAT_00000006;
          break;
        case DelimiterTab:
          psVar13 = (storage_type *)0x4;
          break;
        default:
          local_1f0 = (QArrayData *)0x0;
          goto LAB_005ba9fc;
        }
        QVar68.m_data = psVar13;
        QVar68.m_size = (qsizetype)&local_60;
        QString::fromLatin1(QVar68);
        local_1f0 = &(local_60.d.d)->super_QArrayData;
LAB_005ba9fc:
        pcVar1 = (this->styleNS).d.ptr;
        uVar12 = (this->styleNS).d.size;
        QVar69.m_data = (storage_type *)0x4;
        QVar69.m_size = (qsizetype)&local_60;
        QString::fromLatin1(QVar69);
        QVar107.field_0.m_data = (void *)(local_60.d.size | 0x8000000000000000);
        QVar70.m_size = (size_t)pcVar1;
        QVar70.field_0.m_data_utf8 = (char *)writer;
        QVar91.m_size = (size_t)local_60.d.ptr;
        QVar91.field_0.m_data = (void *)(uVar12 | 0x8000000000000000);
        QVar107.m_size = sVar14;
        QXmlStreamWriter::writeAttribute(QVar70,QVar91,QVar107);
        if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (pQVar19->ucs != L'\0') {
          pcVar1 = (this->styleNS).d.ptr;
          uVar12 = (this->styleNS).d.size;
          QVar71.m_data = (storage_type *)0x4;
          QVar71.m_size = (qsizetype)&local_60;
          QString::fromLatin1(QVar71);
          QVar108.field_0.m_data = (void *)(local_60.d.size | 0x8000000000000000);
          QVar72.m_size = (size_t)pcVar1;
          QVar72.field_0.m_data_utf8 = (char *)writer;
          QVar92.m_size = (size_t)local_60.d.ptr;
          QVar92.field_0.m_data = (void *)(uVar12 | 0x8000000000000000);
          QVar108.m_size = sVar14;
          QXmlStreamWriter::writeAttribute(QVar72,QVar92,QVar108);
          if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
        if (local_1f0 != (QArrayData *)0x0) {
          LOCK();
          (local_1f0->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_1f0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_1f0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_1f0,2,0x10);
          }
        }
        iVar9 = QList<QTextOption::Tab>::end((QList<QTextOption::Tab> *)&local_b8);
        pTVar20 = (Tab *)(pQVar19 + 2);
        pQVar19 = pQVar19 + 8;
      } while (pTVar20 != iVar9.i);
    }
    QXmlStreamWriter::writeEndElement();
    piVar2 = (int *)CONCAT44(local_b8.a.d.d._4_4_,local_b8.a.d.d._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        QArrayData::deallocate
                  ((QArrayData *)CONCAT44(local_b8.a.d.d._4_4_,local_b8.a.d.d._0_4_),0x10,0x10);
      }
    }
  }
  QXmlStreamWriter::writeEndElement();
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextOdfWriter::writeBlockFormat(QXmlStreamWriter &writer, QTextBlockFormat format, int formatIndex) const
{
    writer.writeStartElement(styleNS, QString::fromLatin1("style"));
    writer.writeAttribute(styleNS, QString::fromLatin1("name"), QString::fromLatin1("p%1").arg(formatIndex));
    writer.writeAttribute(styleNS, QString::fromLatin1("family"), QString::fromLatin1("paragraph"));
    writer.writeStartElement(styleNS, QString::fromLatin1("paragraph-properties"));

    if (format.hasProperty(QTextBlockFormat::LineHeightType)) {
        const int blockLineHeightType = format.lineHeightType();
        const qreal blockLineHeight = format.lineHeight();
        QString type, value;
        switch (blockLineHeightType) {
        case QTextBlockFormat::SingleHeight:
            type = QString::fromLatin1("line-height");
            value = QString::fromLatin1("100%");
            break;
        case QTextBlockFormat::ProportionalHeight:
            type = QString::fromLatin1("line-height");
            value = QString::number(blockLineHeight) + QString::fromLatin1("%");
            break;
        case QTextBlockFormat::FixedHeight:
            type = QString::fromLatin1("line-height");
            value = pixelToPoint(qMax(qreal(0.), blockLineHeight));
            break;
        case QTextBlockFormat::MinimumHeight:
            type = QString::fromLatin1("line-height-at-least");
            value = pixelToPoint(qMax(qreal(0.), blockLineHeight));
            break;
        case QTextBlockFormat::LineDistanceHeight:
            type = QString::fromLatin1("line-spacing");
            value = pixelToPoint(qMax(qreal(0.), blockLineHeight));
        }

        if (!type.isNull())
            writer.writeAttribute(styleNS, type, value);
    }

    if (format.hasProperty(QTextFormat::BlockAlignment)) {
        const Qt::Alignment alignment = format.alignment() & Qt::AlignHorizontal_Mask;
        QString value;
        if (alignment == Qt::AlignLeading)
            value = QString::fromLatin1("start");
        else if (alignment == Qt::AlignTrailing)
            value = QString::fromLatin1("end");
        else if (alignment == (Qt::AlignLeft | Qt::AlignAbsolute))
            value = QString::fromLatin1("left");
        else if (alignment == (Qt::AlignRight | Qt::AlignAbsolute))
            value = QString::fromLatin1("right");
        else if (alignment == Qt::AlignHCenter)
            value = QString::fromLatin1("center");
        else if (alignment == Qt::AlignJustify)
            value = QString::fromLatin1("justify");
        else
            qWarning() << "QTextOdfWriter: unsupported paragraph alignment; " << format.alignment();
        if (! value.isNull())
            writer.writeAttribute(foNS, QString::fromLatin1("text-align"), value);
    }

    if (format.hasProperty(QTextFormat::BlockTopMargin))
        writer.writeAttribute(foNS, QString::fromLatin1("margin-top"), pixelToPoint(qMax(qreal(0.), format.topMargin())) );
    if (format.hasProperty(QTextFormat::BlockBottomMargin))
        writer.writeAttribute(foNS, QString::fromLatin1("margin-bottom"), pixelToPoint(qMax(qreal(0.), format.bottomMargin())) );
    if (format.hasProperty(QTextFormat::BlockLeftMargin) || format.hasProperty(QTextFormat::BlockIndent))
        writer.writeAttribute(foNS, QString::fromLatin1("margin-left"), pixelToPoint(qMax(qreal(0.),
            format.leftMargin() + format.indent())));
    if (format.hasProperty(QTextFormat::BlockRightMargin))
        writer.writeAttribute(foNS, QString::fromLatin1("margin-right"), pixelToPoint(qMax(qreal(0.), format.rightMargin())) );
    if (format.hasProperty(QTextFormat::TextIndent))
        writer.writeAttribute(foNS, QString::fromLatin1("text-indent"), pixelToPoint(format.textIndent()));
    if (format.hasProperty(QTextFormat::PageBreakPolicy)) {
        if (format.pageBreakPolicy() & QTextFormat::PageBreak_AlwaysBefore)
            writer.writeAttribute(foNS, QString::fromLatin1("break-before"), QString::fromLatin1("page"));
        if (format.pageBreakPolicy() & QTextFormat::PageBreak_AlwaysAfter)
            writer.writeAttribute(foNS, QString::fromLatin1("break-after"), QString::fromLatin1("page"));
    }
    if (format.hasProperty(QTextFormat::BackgroundBrush)) {
        QBrush brush = format.background();
        writer.writeAttribute(foNS, QString::fromLatin1("background-color"), brush.color().name());
    }
    if (format.hasProperty(QTextFormat::BlockNonBreakableLines))
        writer.writeAttribute(foNS, QString::fromLatin1("keep-together"),
                format.nonBreakableLines() ? QString::fromLatin1("true") : QString::fromLatin1("false"));
    if (format.hasProperty(QTextFormat::TabPositions)) {
        QList<QTextOption::Tab> tabs = format.tabPositions();
        writer.writeStartElement(styleNS, QString::fromLatin1("tab-stops"));
        QList<QTextOption::Tab>::Iterator iterator = tabs.begin();
        while(iterator != tabs.end()) {
            writer.writeEmptyElement(styleNS, QString::fromLatin1("tab-stop"));
            writer.writeAttribute(styleNS, QString::fromLatin1("position"), pixelToPoint(iterator->position) );
            QString type;
            switch(iterator->type) {
            case QTextOption::DelimiterTab: type = QString::fromLatin1("char"); break;
            case QTextOption::LeftTab: type = QString::fromLatin1("left"); break;
            case QTextOption::RightTab: type = QString::fromLatin1("right"); break;
            case QTextOption::CenterTab: type = QString::fromLatin1("center"); break;
            }
            writer.writeAttribute(styleNS, QString::fromLatin1("type"), type);
            if (!iterator->delimiter.isNull())
                writer.writeAttribute(styleNS, QString::fromLatin1("char"), iterator->delimiter);
            ++iterator;
        }

        writer.writeEndElement(); // tab-stops
    }

    writer.writeEndElement(); // paragraph-properties
    writer.writeEndElement(); // style
}